

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcConversionBasedUnit::~IfcConversionBasedUnit
          (IfcConversionBasedUnit *this)

{
  undefined1 *puVar1;
  LazyObject *pLVar2;
  
  *(undefined8 *)&this[-1].field_0x50 = 0x8d51c0;
  *(undefined8 *)&(this->super_IfcNamedUnit).field_0x38 = 0x8d5210;
  (this->super_IfcNamedUnit).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x8d51e8;
  puVar1 = *(undefined1 **)
            &(this->super_IfcNamedUnit).
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.field_0x10;
  if (puVar1 != &(this->super_IfcNamedUnit).
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.field_0x20) {
    operator_delete(puVar1);
  }
  *(undefined8 *)&this[-1].field_0x50 = 0x8d5238;
  *(undefined8 *)&(this->super_IfcNamedUnit).field_0x38 = 0x8d5260;
  pLVar2 = this[-1].ConversionFactor.obj;
  if (pLVar2 != (LazyObject *)&this[-1].field_0x78) {
    operator_delete(pLVar2);
  }
  operator_delete(&this[-1].field_0x50);
  return;
}

Assistant:

IfcConversionBasedUnit() : Object("IfcConversionBasedUnit") {}